

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

void __thiscall HModel::initPh2ColBound(HModel *this,int firstcol,int lastcol)

{
  value_type vVar1;
  double dVar2;
  double dVar3;
  reference pvVar4;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int col;
  undefined4 local_14;
  
  for (local_14 = in_ESI; local_14 <= in_EDX; local_14 = local_14 + 1) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6a8),(long)local_14);
    vVar1 = *pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x7e0),(long)local_14);
    *pvVar4 = vVar1;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6c0),(long)local_14);
    vVar1 = *pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x7f8),(long)local_14);
    *pvVar4 = vVar1;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x7f8),(long)local_14);
    dVar2 = *pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x7e0),(long)local_14);
    dVar3 = *pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x810),(long)local_14);
    *pvVar4 = dVar2 - dVar3;
  }
  return;
}

Assistant:

void HModel::initPh2ColBound(int firstcol, int lastcol) {
  // Copy bounds and compute ranges
  assert(firstcol >= 0);
  assert(lastcol < numCol);
  for (int col = firstcol; col <= lastcol; col++) {
    workLower[col] = colLower[col];
    workUpper[col] = colUpper[col];
    workRange[col] = workUpper[col] - workLower[col];
  }
}